

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  double dVar1;
  iterator __begin1;
  double *pdVar2;
  ostream *poVar3;
  pointer pdVar4;
  iterator __end1;
  double *i;
  long lVar5;
  pointer pdVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  double *i_2;
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> criteria;
  allocator_type local_71;
  vector<double,_std::allocator<double>_> local_70;
  double local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0x4010000000000000;
  uStack_40 = 0x4000000000000000;
  local_58 = 8.0;
  uStack_50 = 0x4014000000000000;
  __l._M_len = 4;
  __l._M_array = &local_58;
  std::vector<double,_std::allocator<double>_>::vector(&local_70,__l,&local_71);
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      switch(uVar9) {
      case 0:
        lVar5 = 6;
        pcVar7 = "Cost: ";
        break;
      case 1:
        lVar5 = 0x16;
        pcVar7 = "Expenses for service: ";
        break;
      case 2:
        lVar5 = 0x11;
        pcVar7 = "Gas consumption: ";
        break;
      case 3:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Comfort: ",9);
        pdVar2 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 3;
        goto LAB_00103c26;
      default:
        goto switchD_00103bd1_default;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar5);
switchD_00103bd1_default:
      pdVar2 = (double *)
               ((long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar8);
LAB_00103c26:
      poVar3 = std::ostream::_M_insert<double>(*pdVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 8;
    } while (uVar9 < (ulong)((long)local_70.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_70.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    dVar1 = 0.0;
    pdVar6 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      dVar1 = dVar1 + *pdVar6;
      pdVar6 = pdVar6 + 1;
      pdVar4 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (pdVar6 != local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    do {
      *pdVar4 = *pdVar4 / dVar1;
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Normalized vector { ",0x14);
  for (pdVar2 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
    poVar3 = std::ostream::_M_insert<double>(*pdVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
  setMarks();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n\nReplacing criteria with restrictions\n",0x28);
  criteria_change();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n\nFormation and narrowing of the Parreto set\n",0x2e);
  Pareto();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n\nWeighting and combining criteria\n",0x24);
  Enum();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n\nHeirarchies\n",0xf);
  Hierarchies();
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    vector<double> criteria={8,5,4,2};
    for(size_t i=0;i<criteria.size();i++){
        if(i==0)
            cout << "Cost: ";
        if(i==1)
            cout << "Expenses for service: ";
        if(i==2)
            cout << "Gas consumption: ";
        if(i==3)
            cout << "Comfort: ";
        cout << criteria[i] << endl;
    }
    normalize(criteria);
    cout << "Normalized vector { ";
    for(const double &i : criteria)
        cout << setprecision(3) << i << " ";

    cout << "}\n";

    setMarks();

    cout << "\n\n\nReplacing criteria with restrictions\n";
    criteria_change();

    cout << "\n\n\nFormation and narrowing of the Parreto set\n";
    Pareto();

    cout << "\n\n\nWeighting and combining criteria\n";
    Enum();

    cout << "\n\n\nHeirarchies\n";
    Hierarchies();
}